

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar5;
  Buffer<char> *pBVar6;
  int iVar7;
  _func_int **pp_Var8;
  size_t __n;
  char *str;
  ptrdiff_t _Num;
  BasicLogger *pBVar9;
  undefined3 in_register_00000081;
  ulong uVar10;
  ulong size;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter pr;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4d8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4c0;
  uint local_4ac;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4a8;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::SOS_1or2_Constraint<1>_>
  *local_498;
  ItemNamer *local_490;
  BasicMemoryWriter<char,_std::allocator<char>_> local_488;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  pBVar9 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar9 == (BasicLogger *)0x0) {
    return;
  }
  iVar7 = (*pBVar9->_vptr_BasicLogger[2])();
  if ((char)iVar7 != '\0') {
    if ((this->super_BasicConstraintKeeper).exporter_ != (BasicLogger *)0x0) {
      local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_00447498;
      local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
      local_258.buffer_.super_Buffer<char>.size_ = 0;
      local_258.buffer_.super_Buffer<char>.capacity_ = 500;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
      local_4c0.wrt_ = &local_258;
      local_4c0.kind_ = Unset;
      local_4c0.n_written_ = 0;
      pp_Var8 = (_func_int **)
                BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
      key._M_str = (char *)0x8;
      key._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var8;
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x381c45,(void *)0xa,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      key_00._M_str = (char *)0x5;
      key_00._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key_00);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(uint)i_con;
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      local_4ac = CONCAT31(in_register_00000081,add2final);
      local_490 = vnam;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      pp_Var8 = (_func_int **)(cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
      if (*(char *)pp_Var8 != '\0') {
        key_01._M_str = (char *)0x4;
        key_01._M_len = (size_t)&local_4c0;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_4d8,key_01);
        if (local_4d8.kind_ == Unset) {
          local_4d8.kind_ = Scalar;
        }
        local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var8;
        fmt::BasicWriter<char>::write
                  (&(local_4d8.wrt_)->super_BasicWriter<char>,0x381c45,(void *)0xa,
                   (size_t)&local_488);
        local_4d8.n_written_ = local_4d8.n_written_ + 1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
        local_498 = this;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
        local_488.super_BasicWriter<char>._vptr_BasicWriter =
             (_func_int **)&PTR__BasicMemoryWriter_00447498;
        local_488.buffer_.super_Buffer<char>.ptr_ = local_488.buffer_.data_;
        local_488.buffer_.super_Buffer<char>.size_ = 0;
        local_488.buffer_.super_Buffer<char>.capacity_ = 500;
        local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
        pcVar3 = (cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
        local_488.super_BasicWriter<char>.buffer_ = &local_488.buffer_.super_Buffer<char>;
        __n = strlen(pcVar3);
        size = local_488.buffer_.super_Buffer<char>.size_ + __n;
        if (local_488.buffer_.super_Buffer<char>.capacity_ < size) {
          fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow
                    (&local_488.buffer_,size);
        }
        if (__n != 0) {
          memmove(local_488.buffer_.super_Buffer<char>.ptr_ +
                  local_488.buffer_.super_Buffer<char>.size_,pcVar3,__n);
        }
        pBVar6 = local_488.super_BasicWriter<char>.buffer_;
        uVar10 = (local_488.super_BasicWriter<char>.buffer_)->size_ + 2;
        local_488.buffer_.super_Buffer<char>.size_ = size;
        if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < uVar10) {
          (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->
             _vptr_Buffer)(local_488.super_BasicWriter<char>.buffer_,uVar10);
        }
        pcVar3 = pBVar6->ptr_;
        sVar4 = pBVar6->size_;
        (pcVar3 + sVar4)[0] = ':';
        (pcVar3 + sVar4)[1] = ' ';
        pBVar6->size_ = uVar10;
        WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,1>
                  (&local_488,(SOS_1or2_Constraint<1> *)cnt,local_490);
        sVar4 = (local_488.super_BasicWriter<char>.buffer_)->size_;
        if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < sVar4 + 1) {
          (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->
             _vptr_Buffer)();
        }
        (local_488.super_BasicWriter<char>.buffer_)->ptr_[sVar4] = '\0';
        pBVar5 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
                 (local_488.super_BasicWriter<char>.buffer_)->ptr_;
        key_02._M_str = (char *)0x7;
        key_02._M_len = (size_t)&local_4c0;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_4a8,key_02);
        this = local_498;
        if (local_4a8.kind_ == Unset) {
          local_4a8.kind_ = Scalar;
        }
        local_4d8.wrt_ = pBVar5;
        fmt::BasicWriter<char>::write
                  (&(local_4a8.wrt_)->super_BasicWriter<char>,0x381c45,(void *)0xa,
                   (size_t)&local_4d8);
        local_4a8.n_written_ = local_4a8.n_written_ + 1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4a8);
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4a8);
        local_488.super_BasicWriter<char>._vptr_BasicWriter =
             (_func_int **)&PTR__BasicMemoryWriter_00447498;
        local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
        if (local_488.buffer_.super_Buffer<char>.ptr_ != local_488.buffer_.data_) {
          operator_delete(local_488.buffer_.super_Buffer<char>.ptr_,
                          local_488.buffer_.super_Buffer<char>.capacity_);
        }
      }
      uVar2 = cnt->depth_;
      key_03._M_str = (char *)0x5;
      key_03._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key_03);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)uVar2;
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      uVar2 = local_4ac;
      cVar1 = cnt->is_unused_;
      key_04._M_str = (char *)0x6;
      key_04._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key_04);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar1 != '\0');
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      cVar1 = cnt->is_bridged_;
      key_05._M_str = (char *)0x7;
      key_05._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key_05);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar1 != '\0');
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      key_06._M_str = (char *)0x5;
      key_06._M_len = (size_t)&local_4c0;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_4d8,key_06);
      if (local_4d8.kind_ == Unset) {
        local_4d8.kind_ = Scalar;
      }
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(uVar2 & 0xff);
      fmt::BasicWriter<char>::write
                (&(local_4d8.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_488)
      ;
      local_4d8.n_written_ = local_4d8.n_written_ + 1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4d8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c0);
      local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)0x0;
      local_488.super_BasicWriter<char>.buffer_ = (Buffer<char> *)0x0;
      fmt::BasicWriter<char>::write
                (&local_258.super_BasicWriter<char>,0x38f4f3,(void *)0x0,(size_t)&local_488);
      pBVar9 = (this->super_BasicConstraintKeeper).exporter_;
      if ((pBVar9 == (BasicLogger *)0x0) ||
         (iVar7 = (*pBVar9->_vptr_BasicLogger[2])(), (char)iVar7 == '\0')) {
        pBVar9 = (BasicLogger *)0x0;
      }
      else {
        pBVar9 = (this->super_BasicConstraintKeeper).exporter_;
      }
      BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar9,&local_258);
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_00447498;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
      if (local_258.buffer_.super_Buffer<char>.ptr_ != local_258.buffer_.data_) {
        operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                        local_258.buffer_.super_Buffer<char>.capacity_);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }